

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * apprun_string_remove_trailing_new_line(char *str)

{
  size_t sVar1;
  char *new;
  uint line_len;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    new._4_4_ = (uint)sVar1;
    if ((new._4_4_ != 0) && (str[new._4_4_ - 1] == '\n')) {
      new._4_4_ = new._4_4_ - 1;
    }
    str_local = (char *)calloc((ulong)(new._4_4_ + 1),1);
    memcpy(str_local,str,(ulong)new._4_4_);
  }
  return str_local;
}

Assistant:

char *apprun_string_remove_trailing_new_line(const char *str) {
    if (str == NULL)
        return NULL;

    unsigned line_len = strlen(str);
    if (line_len > 0 && str[line_len - 1] == '\n')
        line_len--;

    char *new = calloc(line_len + 1, sizeof(char));
    memcpy(new, str, line_len);
    return new;
}